

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint8_t *aStatus,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> _Stack_78;
  promise<ot::commissioner::Error> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::promise<ot::commissioner::Error>::promise(&local_68);
  local_38 = std::
             _Function_handler<void_(const_unsigned_char_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:453:32)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_unsigned_char_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:453:32)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_68;
  local_50._8_8_ = aStatus;
  (*(this->super_Commissioner)._vptr_Commissioner[0x31])
            (this,&local_50,aMulticastAddrList,(ulong)aTimeout);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__basic_future<ot::commissioner::Error>::__basic_future(&_Stack_78,&local_68._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&_Stack_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_78._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<ot::commissioner::Error>::~promise(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::RegisterMulticastListener(uint8_t                        &aStatus,
                                                  const std::vector<std::string> &aMulticastAddrList,
                                                  uint32_t                        aTimeout)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aStatus](const uint8_t *status, Error error) {
        if (status != nullptr)
        {
            aStatus = *status;
        }
        pro.set_value(error);
    };

    RegisterMulticastListener(wait, aMulticastAddrList, aTimeout);
    return pro.get_future().get();
}